

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

Sentinel __thiscall
chaiscript::boxed_cast<std::shared_ptr<bool>&>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  shared_ptr<bool> *psVar5;
  undefined8 *puVar6;
  Data *extraout_RDX;
  Sentinel SVar8;
  Type_Info local_38;
  reference_wrapper<chaiscript::Boxed_Value::Data> rVar7;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_38.m_type_info = (type_info *)&std::shared_ptr<bool>::typeinfo;
    local_38.m_bare_type_info = (type_info *)&bool::typeinfo;
    local_38._16_8_ = local_38._16_8_ & 0xffffffff00000000;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,&local_38);
    if (!bVar4) {
      bVar4 = Type_Conversions::convertable_type<std::shared_ptr<bool>&>
                        (*(Type_Conversions **)t_conversions);
      if (bVar4) {
        bVar4 = Type_Conversions::convertable_type<std::shared_ptr<bool>&>
                          (*(Type_Conversions **)t_conversions);
        if (!bVar4) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
          peVar1 = (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_38.m_flags = (peVar1->m_type_info).m_flags;
          local_38._20_4_ = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
          ptVar2 = (peVar1->m_type_info).m_type_info;
          ptVar3 = (peVar1->m_type_info).m_bare_type_info;
          *puVar6 = &PTR__bad_cast_001cba70;
          local_38.m_type_info._0_4_ = SUB84(ptVar2,0);
          local_38.m_type_info._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
          local_38.m_bare_type_info._0_4_ = SUB84(ptVar3,0);
          local_38.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
          *(undefined4 *)(puVar6 + 1) = local_38.m_type_info._0_4_;
          *(undefined4 *)((long)puVar6 + 0xc) = local_38.m_type_info._4_4_;
          *(undefined4 *)(puVar6 + 2) = local_38.m_bare_type_info._0_4_;
          *(undefined4 *)((long)puVar6 + 0x14) = local_38.m_bare_type_info._4_4_;
          puVar6[3] = local_38._16_8_;
          puVar6[4] = &std::shared_ptr<bool>::typeinfo;
          puVar6[5] = 0x19;
          puVar6[6] = "Cannot perform boxed_cast";
          local_38.m_type_info = ptVar2;
          local_38.m_bare_type_info = ptVar3;
          __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        Type_Conversions::boxed_type_conversion<std::shared_ptr<bool>&>
                  ((Type_Conversions *)&local_38,*(Conversion_Saves **)t_conversions,
                   *(Boxed_Value **)(t_conversions + 8));
        psVar5 = detail::Any::cast<std::shared_ptr<bool>>((Any *)(local_38.m_type_info + 0x18));
        *(shared_ptr<bool> **)this = psVar5;
        *(type_info **)(this + 8) = local_38.m_type_info;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.m_bare_type_info);
        rVar7._M_data = extraout_RDX;
        goto LAB_00192b5f;
      }
    }
  }
  SVar8 = detail::Cast_Helper_Inner<std::shared_ptr<bool>_&>::cast
                    ((Boxed_Value *)this,(Type_Conversions_State *)bv);
  rVar7 = SVar8.m_data._M_data;
LAB_00192b5f:
  SVar8.m_data._M_data = rVar7._M_data;
  SVar8.m_ptr._M_data =
       (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)this;
  return SVar8;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }